

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RC interp(NODE *n)

{
  NODE *n_00;
  int iVar1;
  AttrType AVar2;
  int nConditions;
  RC RVar3;
  size_t sVar4;
  node *pnVar5;
  char **ppcVar6;
  AttrType AVar7;
  AttrType *pAVar8;
  Condition *extraout_RDX;
  Condition *extraout_RDX_00;
  long lVar9;
  Condition *pCVar10;
  node *pnVar11;
  char *pcVar12;
  char *pcVar13;
  int *piVar14;
  long lVar15;
  RelAttr local_cc8;
  Value rhsValue;
  RelAttr relAttrs [40];
  AttrInfo attrInfos [40];
  
  iVar1 = isatty(0);
  pCVar10 = extraout_RDX;
  if (iVar1 != 0) goto LAB_00119f3a;
  switch(n->kind) {
  case N_CREATETABLE:
    printf("create table %s (",(n->u).CREATETABLE.relname);
    for (pnVar5 = (n->u).CREATETABLE.attrlist;
        (pnVar5 != (node *)0x0 &&
        (pnVar11 = (pnVar5->u).QUERY.relattrlist,
        printf("%s = %s",(pnVar11->u).CREATETABLE.relname,(pnVar11->u).CREATETABLE.attrlist),
        (pnVar5->u).CREATETABLE.attrlist != (node *)0x0)); pnVar5 = (pnVar5->u).CREATETABLE.attrlist
        ) {
      printf(", ");
    }
    putchar(0x29);
    break;
  case N_CREATEINDEX:
    pcVar13 = (n->u).CREATETABLE.relname;
    pnVar5 = (n->u).CREATETABLE.attrlist;
    pcVar12 = "create index %s(%s);\n";
    goto LAB_00119de4;
  case N_DROPTABLE:
    pcVar13 = (n->u).CREATETABLE.relname;
    pcVar12 = "drop table %s;\n";
    goto LAB_00119db8;
  case N_DROPINDEX:
    pcVar13 = (n->u).CREATETABLE.relname;
    pnVar5 = (n->u).CREATETABLE.attrlist;
    pcVar12 = "drop index %s(%s);\n";
    goto LAB_00119de4;
  case N_LOAD:
    pcVar13 = (n->u).CREATETABLE.relname;
    pnVar5 = (n->u).CREATETABLE.attrlist;
    pcVar12 = "load %s(\"%s\");\n";
    goto LAB_00119de4;
  case N_SET:
    pcVar13 = (n->u).CREATETABLE.relname;
    pnVar5 = (n->u).CREATETABLE.attrlist;
    pcVar12 = "set %s = \"%s\";\n";
LAB_00119de4:
    printf(pcVar12,pcVar13,pnVar5);
    goto switchD_00119c83_default;
  case N_HELP:
    printf("help");
    if ((n->u).CREATETABLE.relname != (char *)0x0) {
      printf(" %s");
    }
    break;
  case N_PRINT:
    pcVar13 = (n->u).CREATETABLE.relname;
    pcVar12 = "print %s;\n";
LAB_00119db8:
    printf(pcVar12,pcVar13);
    goto switchD_00119c83_default;
  case N_QUERY:
    printf("select ");
    for (pnVar5 = (n->u).QUERY.relattrlist;
        (pnVar5 != (node *)0x0 &&
        (print_relattr((pnVar5->u).QUERY.relattrlist),
        (pnVar5->u).CREATETABLE.attrlist != (node *)0x0)); pnVar5 = (pnVar5->u).CREATETABLE.attrlist
        ) {
      putchar(0x2c);
    }
    printf("\n from ");
    for (pnVar5 = (n->u).CREATETABLE.attrlist;
        (pnVar5 != (node *)0x0 &&
        (printf(" %s",(((pnVar5->u).QUERY.relattrlist)->u).CREATETABLE.relname),
        (pnVar5->u).CREATETABLE.attrlist != (node *)0x0)); pnVar5 = (pnVar5->u).CREATETABLE.attrlist
        ) {
      putchar(0x2c);
    }
    putchar(10);
    if ((n->u).QUERY.conditionlist != (node *)0x0) {
      printf("where ");
      pnVar5 = (n->u).QUERY.conditionlist;
LAB_00119f1a:
      print_conditions(pnVar5);
    }
    break;
  case N_INSERT:
    printf("insert into %s values ( ",(n->u).CREATETABLE.relname);
    for (pnVar5 = (n->u).CREATETABLE.attrlist;
        (pnVar5 != (node *)0x0 &&
        (print_value((pnVar5->u).QUERY.relattrlist), (pnVar5->u).CREATETABLE.attrlist != (node *)0x0
        )); pnVar5 = (pnVar5->u).CREATETABLE.attrlist) {
      putchar(0x2c);
    }
    pcVar13 = ");";
    goto LAB_00119f26;
  case N_DELETE:
    printf("delete %s ",(n->u).CREATETABLE.relname);
    if ((n->u).CREATETABLE.attrlist != (node *)0x0) {
      printf("where ");
      pnVar5 = (n->u).CREATETABLE.attrlist;
      goto LAB_00119f1a;
    }
    break;
  case N_UPDATE:
    printf("update %s set ",(n->u).CREATETABLE.relname);
    print_relattr((n->u).CREATETABLE.attrlist);
    printf(" = ");
    pnVar5 = (n->u).QUERY.conditionlist;
    n_00 = (pnVar5->u).QUERY.relattrlist;
    if (n_00 == (NODE *)0x0) {
      print_value((pnVar5->u).CREATETABLE.attrlist);
    }
    else {
      print_relattr(n_00);
    }
    if ((n->u).UPDATE.conditionlist != (node *)0x0) {
      printf("where ");
      pnVar5 = (n->u).UPDATE.conditionlist;
      goto LAB_00119f1a;
    }
    break;
  default:
    goto switchD_00119c83_default;
  }
  pcVar13 = ";";
LAB_00119f26:
  puts(pcVar13);
switchD_00119c83_default:
  fflush(_stdout);
  pCVar10 = extraout_RDX_00;
LAB_00119f3a:
  RVar3 = 0;
  switch(n->kind) {
  case N_CREATETABLE:
    pcVar13 = (n->u).CREATETABLE.relname;
    sVar4 = strlen(pcVar13);
    if (sVar4 < 0x19) {
      pnVar5 = (n->u).CREATETABLE.attrlist;
      if (pnVar5 == (node *)0x0) {
        lVar9 = 0;
      }
      else {
        piVar14 = &attrInfos[0].attrLength;
        lVar9 = 0;
        do {
          if (lVar9 == 0x28) {
            nConditions = -2;
LAB_0011a43e:
            pcVar13 = "create";
            goto LAB_0011a4aa;
          }
          pnVar11 = (pnVar5->u).QUERY.relattrlist;
          sVar4 = strlen((pnVar11->u).CREATETABLE.relname);
          if (0x18 < sVar4) {
            nConditions = -9;
            goto LAB_0011a43e;
          }
          iVar1 = __isoc99_sscanf((pnVar11->u).CREATETABLE.attrlist,"%c%d",&rhsValue,relAttrs);
          nConditions = -6;
          if (iVar1 != 2) {
            if (iVar1 == 1) {
              nConditions = -3;
              AVar7 = rhsValue.type & 0xff;
              if ((rhsValue.type & 0xff) < 0x69) {
                if ((rhsValue.type & 0xff) == 0x66) {
LAB_0011a07e:
                  AVar2 = FLOAT;
                  goto LAB_0011a083;
                }
                if (AVar7 != 99) {
LAB_0011a4e0:
                  nConditions = -6;
                }
              }
              else {
                AVar2 = INT;
                if (AVar7 == 0x69) {
LAB_0011a083:
                  relAttrs[0].relName = (char *)CONCAT44(relAttrs[0].relName._4_4_,4);
LAB_0011a08e:
                  iVar1 = 4;
                  goto LAB_0011a093;
                }
                if (AVar7 == 0x72) goto LAB_0011a07e;
                if (AVar7 != 0x73) goto LAB_0011a4e0;
              }
            }
            goto LAB_0011a43e;
          }
          if ((rhsValue.type & 0xff) < 0x69) {
            if ((rhsValue.type & 0xff) != 99) {
              if ((rhsValue.type & 0xff) == 0x66) goto LAB_0011a041;
              goto LAB_0011a43e;
            }
          }
          else if ((rhsValue.type & 0xff) != 0x73) {
            if ((rhsValue.type & 0xff) == 0x72) {
LAB_0011a041:
              if ((int)relAttrs[0].relName == 4) {
                AVar2 = FLOAT;
                goto LAB_0011a08e;
              }
              nConditions = -5;
            }
            else if ((rhsValue.type & 0xff) == 0x69) {
              if ((int)relAttrs[0].relName == 4) {
                AVar2 = INT;
                goto LAB_0011a08e;
              }
              nConditions = -4;
            }
            goto LAB_0011a43e;
          }
          AVar2 = STRING;
          iVar1 = (int)relAttrs[0].relName;
          if ((int)relAttrs[0].relName - 0x100U < 0xffffff01) {
            nConditions = -7;
            goto LAB_0011a43e;
          }
LAB_0011a093:
          ((AttrInfo *)(piVar14 + -3))->attrName = (pnVar11->u).CREATETABLE.relname;
          piVar14[-1] = AVar2;
          *piVar14 = iVar1;
          lVar9 = lVar9 + 1;
          pnVar5 = (pnVar5->u).CREATETABLE.attrlist;
          piVar14 = piVar14 + 4;
        } while (pnVar5 != (node *)0x0);
        pcVar13 = (n->u).CREATETABLE.relname;
      }
      RVar3 = SM_Manager::CreateTable(pSmm,pcVar13,(int)lVar9,attrInfos);
    }
    else {
      interp();
      RVar3 = 0;
    }
    break;
  case N_CREATEINDEX:
    RVar3 = SM_Manager::CreateIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_DROPTABLE:
    RVar3 = SM_Manager::DropTable(pSmm,(n->u).CREATETABLE.relname);
    return RVar3;
  case N_DROPINDEX:
    RVar3 = SM_Manager::DropIndex(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_LOAD:
    RVar3 = SM_Manager::Load(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_SET:
    RVar3 = SM_Manager::Set(pSmm,(n->u).CREATETABLE.relname,(n->u).CREATEINDEX.attrname);
    return RVar3;
  case N_HELP:
    pcVar13 = (n->u).CREATETABLE.relname;
    if (pcVar13 == (char *)0x0) {
      RVar3 = SM_Manager::Help(pSmm);
      return RVar3;
    }
    RVar3 = SM_Manager::Help(pSmm,pcVar13);
    return RVar3;
  case N_PRINT:
    RVar3 = SM_Manager::Print(pSmm,(n->u).CREATETABLE.relname);
    return RVar3;
  case N_QUERY:
    pnVar5 = (n->u).QUERY.relattrlist;
    lVar9 = 0;
    lVar15 = 0;
    if (pnVar5 != (node *)0x0) {
      ppcVar6 = &relAttrs[0].attrName;
      lVar15 = 0;
      do {
        if (lVar15 == 0x28) goto LAB_0011a36a;
        pnVar11 = (pnVar5->u).QUERY.relattrlist;
        ((RelAttr *)(ppcVar6 + -1))->relName = (pnVar11->u).CREATETABLE.relname;
        pCVar10 = (Condition *)(pnVar11->u).CREATETABLE.attrlist;
        *ppcVar6 = (char *)pCVar10;
        lVar15 = lVar15 + 1;
        pnVar5 = (pnVar5->u).CREATETABLE.attrlist;
        ppcVar6 = ppcVar6 + 2;
      } while (pnVar5 != (node *)0x0);
    }
    pnVar5 = (n->u).CREATETABLE.attrlist;
    if (pnVar5 != (node *)0x0) {
      lVar9 = 0;
      do {
        if (lVar9 == 0x28) goto LAB_0011a36a;
        *(char **)(&rhsValue.type + lVar9 * 2) =
             (((pnVar5->u).QUERY.relattrlist)->u).CREATETABLE.relname;
        lVar9 = lVar9 + 1;
        pnVar5 = (pnVar5->u).CREATETABLE.attrlist;
      } while (pnVar5 != (node *)0x0);
    }
    nConditions = mk_conditions((n->u).QUERY.conditionlist,(int)(Condition *)attrInfos,pCVar10);
    if (-1 < nConditions) {
      RVar3 = QL_Manager::Select(pQlm,(int)lVar15,relAttrs,(int)lVar9,(char **)&rhsValue,nConditions
                                 ,(Condition *)attrInfos);
      return RVar3;
    }
    pcVar13 = "select";
    goto LAB_0011a4aa;
  case N_INSERT:
    pnVar5 = (n->u).CREATETABLE.attrlist;
    if (pnVar5 == (node *)0x0) {
      lVar9 = 0;
    }
    else {
      pAVar8 = &attrInfos[0].attrType;
      lVar9 = 0;
      do {
        if (lVar9 == 0x28) {
          pcVar13 = "insert";
          goto LAB_0011a41d;
        }
        pnVar11 = (pnVar5->u).QUERY.relattrlist;
        AVar7 = (pnVar11->u).VALUE.type;
        *(AttrType *)&((AttrInfo *)(pAVar8 + -2))->attrName = AVar7;
        if (AVar7 == STRING) {
          pnVar11 = (pnVar11->u).QUERY.conditionlist;
LAB_0011a16a:
          *(node **)pAVar8 = pnVar11;
        }
        else {
          if (AVar7 == FLOAT) {
            pnVar11 = (node *)((long)&pnVar11->u + 8);
            goto LAB_0011a16a;
          }
          if (AVar7 == INT) {
            pnVar11 = (node *)((long)&pnVar11->u + 4);
            goto LAB_0011a16a;
          }
        }
        lVar9 = lVar9 + 1;
        pnVar5 = (pnVar5->u).CREATETABLE.attrlist;
        pAVar8 = pAVar8 + 4;
      } while (pnVar5 != (node *)0x0);
    }
    RVar3 = QL_Manager::Insert(pQlm,(n->u).CREATETABLE.relname,(int)lVar9,(Value *)attrInfos);
    break;
  case N_DELETE:
    iVar1 = mk_conditions((n->u).CREATETABLE.attrlist,(int)attrInfos,pCVar10);
    if (iVar1 < 0) {
      print_error("delete",iVar1);
      RVar3 = 0;
    }
    else {
      RVar3 = QL_Manager::Delete(pQlm,(n->u).CREATETABLE.relname,iVar1,(Condition *)attrInfos);
    }
    break;
  case N_UPDATE:
    pnVar5 = (n->u).CREATETABLE.attrlist;
    relAttrs[0].relName = (pnVar5->u).CREATETABLE.relname;
    relAttrs[0].attrName = (pnVar5->u).CREATEINDEX.attrname;
    pnVar5 = (n->u).QUERY.conditionlist;
    pnVar11 = (pnVar5->u).QUERY.relattrlist;
    if (pnVar11 == (node *)0x0) {
      ppcVar6 = (char **)&rhsValue.data;
      pnVar5 = (pnVar5->u).CREATETABLE.attrlist;
      rhsValue.type = (pnVar5->u).VALUE.type;
      pCVar10 = (Condition *)(ulong)rhsValue.type;
      if (rhsValue.type == STRING) {
        pnVar5 = (pnVar5->u).QUERY.conditionlist;
LAB_0011a451:
        iVar1 = 1;
        goto LAB_0011a456;
      }
      if (rhsValue.type == FLOAT) {
        pnVar5 = (node *)((long)&pnVar5->u + 8);
        goto LAB_0011a451;
      }
      iVar1 = 1;
      if (rhsValue.type == INT) {
        pnVar5 = (node *)((long)&pnVar5->u + 4);
        iVar1 = 1;
        goto LAB_0011a456;
      }
    }
    else {
      ppcVar6 = &local_cc8.attrName;
      pCVar10 = (Condition *)(pnVar11->u).QUERY.relattrlist;
      pnVar5 = (pnVar11->u).CREATETABLE.attrlist;
      iVar1 = 0;
      local_cc8.relName = (char *)pCVar10;
LAB_0011a456:
      *ppcVar6 = (char *)pnVar5;
    }
    nConditions = mk_conditions((n->u).UPDATE.conditionlist,(int)(Condition *)attrInfos,pCVar10);
    if (-1 < nConditions) {
      RVar3 = QL_Manager::Update(pQlm,(n->u).CREATETABLE.relname,relAttrs,iVar1,&local_cc8,&rhsValue
                                 ,nConditions,(Condition *)attrInfos);
      return RVar3;
    }
    pcVar13 = "update";
LAB_0011a4aa:
    print_error(pcVar13,nConditions);
    RVar3 = 0;
  }
  return RVar3;
LAB_0011a36a:
  pcVar13 = "select";
LAB_0011a41d:
  nConditions = -2;
  goto LAB_0011a4aa;
}

Assistant:

RC interp(NODE *n)
{
   RC errval = 0;         /* returned error value      */

   /* if input not coming from a terminal, then echo the query */
   if(!isatty(0))
      echo_query(n);

   switch(n -> kind){

      case N_CREATETABLE:            /* for CreateTable() */
         {
            int nattrs;
            AttrInfo attrInfos[MAXATTRS];

            /* Make sure relation name isn't too long */
            if(strlen(n -> u.CREATETABLE.relname) > MAXNAME){
               print_error((char*)"create", E_TOOLONG);
               break;
            }

            /* Make a list of AttrInfos suitable for sending to Create */
            nattrs = mk_attr_infos(n -> u.CREATETABLE.attrlist, MAXATTRS, 
                  attrInfos);
            if(nattrs < 0){
               print_error((char*)"create", nattrs);
               break;
            }

            /* Make the call to create */
            errval = pSmm->CreateTable(n->u.CREATETABLE.relname, nattrs, 
                  attrInfos);
            break;
         }   

      case N_CREATEINDEX:            /* for CreateIndex() */

         errval = pSmm->CreateIndex(n->u.CREATEINDEX.relname,
               n->u.CREATEINDEX.attrname);
         break;

      case N_DROPINDEX:            /* for DropIndex() */

         errval = pSmm->DropIndex(n->u.DROPINDEX.relname,
               n->u.DROPINDEX.attrname);
         break;

      case N_DROPTABLE:            /* for DropTable() */

         errval = pSmm->DropTable(n->u.DROPTABLE.relname);
         break;

      case N_LOAD:            /* for Load() */

         errval = pSmm->Load(n->u.LOAD.relname,
               n->u.LOAD.filename);
         break;

      case N_SET:                    /* for Set() */

         errval = pSmm->Set(n->u.SET.paramName,
               n->u.SET.string);
         break;

      case N_HELP:            /* for Help() */

         if (n->u.HELP.relname)
            errval = pSmm->Help(n->u.HELP.relname);
         else
            errval = pSmm->Help();
         break;

      case N_PRINT:            /* for Print() */

         errval = pSmm->Print(n->u.PRINT.relname);
         break;

      case N_QUERY:            /* for Query() */
         {
            int       nSelAttrs = 0;
            RelAttr  relAttrs[MAXATTRS];
            int       nRelations = 0;
            char      *relations[MAXATTRS];
            int       nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of RelAttrs suitable for sending to Query */
            nSelAttrs = mk_rel_attrs(n->u.QUERY.relattrlist, MAXATTRS,
                  relAttrs);
            if(nSelAttrs < 0){
               print_error((char*)"select", nSelAttrs);
               break;
            }

            /* Make a list of relation names suitable for sending to Query */
            nRelations = mk_relations(n->u.QUERY.rellist, MAXATTRS, relations);
            if(nRelations < 0){
               print_error((char*)"select", nRelations);
               break;
            }

            /* Make a list of Conditions suitable for sending to Query */
            nConditions = mk_conditions(n->u.QUERY.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"select", nConditions);
               break;
            }

            /* Make the call to Select */
            errval = pQlm->Select(nSelAttrs, relAttrs,
                  nRelations, relations,
                  nConditions, conditions);
            break;
         }   

      case N_INSERT:            /* for Insert() */
         {
            int nValues = 0;
            Value values[MAXATTRS];

            /* Make a list of Values suitable for sending to Insert */
            nValues = mk_values(n->u.INSERT.valuelist, MAXATTRS, values);
            if(nValues < 0){
               print_error((char*)"insert", nValues);
               break;
            }

            /* Make the call to insert */
            errval = pQlm->Insert(n->u.INSERT.relname,
                  nValues, values);
            break;
         }   

      case N_DELETE:            /* for Delete() */
         {
            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a list of Conditions suitable for sending to delete */
            nConditions = mk_conditions(n->u.DELETE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"delete", nConditions);
               break;
            }

            /* Make the call to delete */
            errval = pQlm->Delete(n->u.DELETE.relname,
                  nConditions, conditions);
            break;
         }   

      case N_UPDATE:            /* for Update() */
         {
            RelAttr relAttr;

            // The RHS can be either a value or an attribute
            Value rhsValue;
            RelAttr rhsRelAttr;
            int bIsValue;

            int nConditions = 0;
            Condition conditions[MAXATTRS];

            /* Make a RelAttr suitable for sending to Update */
            mk_rel_attr(n->u.UPDATE.relattr, relAttr);

            struct node *rhs = n->u.UPDATE.relorvalue;
            if (rhs->u.RELATTR_OR_VALUE.relattr) {
               mk_rel_attr(rhs->u.RELATTR_OR_VALUE.relattr, rhsRelAttr);
               bIsValue = 0;
            } else {
               /* Make a value suitable for sending to update */
               mk_value(rhs->u.RELATTR_OR_VALUE.value, rhsValue);
               bIsValue = 1;
            }

            /* Make a list of Conditions suitable for sending to Update */
            nConditions = mk_conditions(n->u.UPDATE.conditionlist, MAXATTRS,
                  conditions);
            if(nConditions < 0){
               print_error((char*)"update", nConditions);
               break;
            }

            /* Make the call to update */
            errval = pQlm->Update(n->u.UPDATE.relname, relAttr, bIsValue, 
                  rhsRelAttr, rhsValue, nConditions, conditions);
            break;
         }   

      default:   // should never get here
         break;
   }

   return (errval);
}